

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O0

h__TextParser * __thiscall
AS_02::TimedText::ST2052_TextParser::h__TextParser::OpenRead(h__TextParser *this)

{
  byte bVar1;
  bool bVar2;
  __type _Var3;
  char *pcVar4;
  ulong uVar5;
  reference pbVar6;
  byte_t *pbVar7;
  ILogSink *pIVar8;
  undefined8 uVar9;
  string *in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>,_bool>
  pVar10;
  byte local_562;
  _Self local_4b8;
  _Self local_4b0;
  AutoMutex local_4a8;
  AutoMutex l;
  MIMEType_t local_48c;
  UUID local_488;
  pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t> local_468;
  undefined1 auStack_440 [8];
  TimedTextResourceDescriptor font_resource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  allocator<char> local_3d9;
  string local_3d8 [32];
  string local_3b8;
  undefined1 local_398 [8];
  UUID font_id;
  char local_368 [8];
  char buf [64];
  allocator<char> local_319;
  string local_318;
  undefined1 local_2f8 [8];
  AttributeVisitor font_visitor;
  MIMEType_t local_294;
  UUID local_290;
  pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t> local_270;
  undefined1 auStack_244 [8];
  TimedTextResourceDescriptor png_resource;
  undefined1 local_210 [8];
  UUID asset_id;
  allocator<char> local_1d9;
  string local_1d8;
  undefined1 local_1b8 [8];
  AttributeVisitor png_visitor;
  allocator<char> local_151;
  string local_150;
  undefined1 local_130 [8];
  AttributeVisitor profile_visitor;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  ElementVisitor conforms_visitor;
  const_iterator i;
  allocator<char> local_39;
  string local_38 [40];
  h__TextParser *this_local;
  
  this_local = this;
  setup_default_font_family_list();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,pcVar4,&local_39);
  bVar1 = Kumu::XMLElement::ParseString(in_RSI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    std::__cxx11::string::operator=(in_RSI + 0x130,"UTF-8");
    std::__cxx11::
    list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
    ::clear((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
             *)(in_RSI + 0x150));
    *(undefined4 *)(in_RSI + 0xf8) = 0;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"conformsToStandard",&local_c9);
      Kumu::ElementVisitor::ElementVisitor((ElementVisitor *)local_a8,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      Kumu::apply_visitor<Kumu::ElementVisitor>((XMLElement *)in_RSI,(ElementVisitor *)local_a8);
      conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&conforms_visitor.element_name.field_2 + 8));
      while( true ) {
        profile_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&conforms_visitor.element_name.field_2 + 8));
        bVar2 = std::operator!=((_Self *)&conforms_visitor.value_list._M_t._M_impl.
                                          super__Rb_tree_header._M_node_count,
                                (_Self *)&profile_visitor.value_list._M_t._M_impl.
                                          super__Rb_tree_header._M_node_count);
        if (!bVar2) break;
        pbVar6 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
        _Var3 = std::operator==(pbVar6,&IMSC1_imageProfile_abi_cxx11_);
        if (_Var3) {
LAB_001a24dd:
          pbVar6 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
          std::__cxx11::string::operator=(in_RSI + 0x110,(string *)pbVar6);
          break;
        }
        pbVar6 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
        _Var3 = std::operator==(pbVar6,&IMSC1_textProfile_abi_cxx11_);
        if (_Var3) goto LAB_001a24dd;
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count);
      }
      Kumu::ElementVisitor::~ElementVisitor((ElementVisitor *)local_a8);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"profile",&local_151);
      Kumu::AttributeVisitor::AttributeVisitor((AttributeVisitor *)local_130,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      Kumu::apply_visitor<Kumu::AttributeVisitor>
                ((XMLElement *)in_RSI,(AttributeVisitor *)local_130);
      conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&profile_visitor.attr_name.field_2 + 8));
      while( true ) {
        png_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&profile_visitor.attr_name.field_2 + 8));
        bVar2 = std::operator!=((_Self *)&conforms_visitor.value_list._M_t._M_impl.
                                          super__Rb_tree_header._M_node_count,
                                (_Self *)&png_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
        if (!bVar2) break;
        pbVar6 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
        _Var3 = std::operator==(pbVar6,&IMSC1_imageProfile_abi_cxx11_);
        if (_Var3) {
LAB_001a268d:
          pbVar6 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
          std::__cxx11::string::operator=(in_RSI + 0x110,(string *)pbVar6);
          break;
        }
        pbVar6 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
        _Var3 = std::operator==(pbVar6,&IMSC1_textProfile_abi_cxx11_);
        if (_Var3) goto LAB_001a268d;
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count);
      }
      Kumu::AttributeVisitor::~AttributeVisitor((AttributeVisitor *)local_130);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"backgroundImage",&local_1d9);
    Kumu::AttributeVisitor::AttributeVisitor((AttributeVisitor *)local_1b8,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    Kumu::apply_visitor<Kumu::AttributeVisitor>((XMLElement *)in_RSI,(AttributeVisitor *)local_1b8);
    conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&png_visitor.attr_name.field_2 + 8));
    while( true ) {
      asset_id.super_Identifier<16U>._24_8_ =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&png_visitor.attr_name.field_2 + 8));
      bVar2 = std::operator!=((_Self *)&conforms_visitor.value_list._M_t._M_impl.
                                        super__Rb_tree_header._M_node_count,
                              (_Self *)(asset_id.super_Identifier<16U>.m_Value + 0xf));
      if (!bVar2) break;
      pbVar6 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count);
      Kumu::PathBasename((string *)(png_resource.ResourceID + 0xc),(char)pbVar6);
      CreatePNGNameId((UUID *)local_210,(string *)(png_resource.ResourceID + 0xc));
      std::__cxx11::string::~string((string *)(png_resource.ResourceID + 0xc));
      ASDCP::TimedText::TimedTextResourceDescriptor::TimedTextResourceDescriptor
                ((TimedTextResourceDescriptor *)auStack_244);
      pbVar7 = Kumu::Identifier<16U>::Value((Identifier<16U> *)local_210);
      auStack_244 = *(undefined1 (*) [8])pbVar7;
      png_resource.ResourceID._0_8_ = *(undefined8 *)(pbVar7 + 8);
      png_resource.ResourceID[8] = '\x01';
      png_resource.ResourceID[9] = '\0';
      png_resource.ResourceID[10] = '\0';
      png_resource.ResourceID[0xb] = '\0';
      std::__cxx11::
      list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
      ::push_back((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                   *)(in_RSI + 0x150),(value_type *)auStack_244);
      Kumu::UUID::UUID(&local_290,auStack_244);
      local_294 = MT_PNG;
      std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>::
      pair<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_true>(&local_270,&local_290,&local_294);
      pVar10 = std::
               map<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
               ::insert((map<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
                         *)(in_RSI + 0x80),&local_270);
      font_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)pVar10.first._M_node;
      std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>::~pair(&local_270);
      Kumu::UUID::~UUID(&local_290);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        std::__cxx11::string::operator=(in_RSI + 0x110,(string *)&IMSC1_imageProfile_abi_cxx11_);
      }
      Kumu::UUID::~UUID((UUID *)local_210);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
    }
    bVar2 = std::
            map<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
            ::empty((map<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
                     *)(in_RSI + 0x80));
    if ((!bVar2) &&
       (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(in_RSI + 0x110),&IMSC1_textProfile_abi_cxx11_), _Var3)) {
      pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn(pIVar8,"Unexpected IMSC-1 text profile; document contains images.\n ");
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn(pIVar8,"Using default IMSC-1 text profile.\n ");
      std::__cxx11::string::operator=(in_RSI + 0x110,(string *)&IMSC1_textProfile_abi_cxx11_);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"fontFamily",&local_319)
    ;
    Kumu::AttributeVisitor::AttributeVisitor((AttributeVisitor *)local_2f8,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
    Kumu::apply_visitor<Kumu::AttributeVisitor>((XMLElement *)in_RSI,(AttributeVisitor *)local_2f8);
    conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&font_visitor.attr_name.field_2 + 8));
    while( true ) {
      font_id.super_Identifier<16U>._24_8_ =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&font_visitor.attr_name.field_2 + 8));
      bVar2 = std::operator!=((_Self *)&conforms_visitor.value_list._M_t._M_impl.
                                        super__Rb_tree_header._M_node_count,
                              (_Self *)(font_id.super_Identifier<16U>.m_Value + 0xf));
      if (!bVar2) break;
      pbVar6 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count);
      Kumu::PathBasename((string *)&local_3b8,(char)pbVar6);
      CreateFontNameId((UUID *)local_398,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      bVar2 = false;
      font_resource.ResourceID[0xf] = '\0';
      pcVar4 = Kumu::UUID::EncodeHex((UUID *)local_398,local_368,0x40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3d8,pcVar4,&local_3d9);
      bVar1 = Kumu::PathIsFile(local_3d8);
      local_562 = 1;
      if ((bVar1 & 1) == 0) {
        pbVar6 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
        std::operator+(&local_400,pbVar6,".ttf");
        bVar2 = true;
        bVar1 = Kumu::PathIsFile((string *)&local_400);
        local_562 = 1;
        if ((bVar1 & 1) == 0) {
          pbVar6 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &font_resource.Type,pbVar6,".otf");
          font_resource.ResourceID[0xf] = '\x01';
          local_562 = Kumu::PathIsFile((string *)&font_resource.Type);
        }
      }
      if ((font_resource.ResourceID[0xf] & 1) != 0) {
        std::__cxx11::string::~string((string *)&font_resource.Type);
      }
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_400);
      }
      std::__cxx11::string::~string(local_3d8);
      std::allocator<char>::~allocator(&local_3d9);
      if ((local_562 & 1) == 0) {
        Kumu::AutoMutex::AutoMutex(&local_4a8,&sg_default_font_family_list_lock);
        pbVar6 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
        local_4b0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&sg_default_font_family_list_abi_cxx11_,pbVar6);
        local_4b8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&sg_default_font_family_list_abi_cxx11_);
        bVar2 = std::operator==(&local_4b0,&local_4b8);
        if (bVar2) {
          pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count);
          uVar9 = std::__cxx11::string::c_str();
          Kumu::ILogSink::Error(pIVar8,"Unable to locate external font resource \"%s\".\n",uVar9);
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
        }
        Kumu::AutoMutex::~AutoMutex(&local_4a8);
        if (!bVar2) goto LAB_001a30d9;
      }
      else {
        ASDCP::TimedText::TimedTextResourceDescriptor::TimedTextResourceDescriptor
                  ((TimedTextResourceDescriptor *)auStack_440);
        pbVar7 = Kumu::Identifier<16U>::Value((Identifier<16U> *)local_398);
        auStack_440 = *(undefined1 (*) [8])pbVar7;
        font_resource.ResourceID._0_8_ = *(undefined8 *)(pbVar7 + 8);
        font_resource.ResourceID[8] = '\x02';
        font_resource.ResourceID[9] = '\0';
        font_resource.ResourceID[10] = '\0';
        font_resource.ResourceID[0xb] = '\0';
        std::__cxx11::
        list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
        ::push_back((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                     *)(in_RSI + 0x150),(value_type *)auStack_440);
        Kumu::UUID::UUID(&local_488,auStack_440);
        local_48c = MT_OPENTYPE;
        std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>::
        pair<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_true>(&local_468,&local_488,&local_48c);
        pVar10 = std::
                 map<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
                 ::insert((map<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
                           *)(in_RSI + 0x80),&local_468);
        l.m_Mutex = (Mutex *)pVar10.first._M_node;
        std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>::~pair(&local_468);
        Kumu::UUID::~UUID(&local_488);
LAB_001a30d9:
        bVar2 = false;
      }
      Kumu::UUID::~UUID((UUID *)local_398);
      if (bVar2 != false) goto LAB_001a3138;
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&conforms_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
LAB_001a3138:
    Kumu::AttributeVisitor::~AttributeVisitor((AttributeVisitor *)local_2f8);
    Kumu::AttributeVisitor::~AttributeVisitor((AttributeVisitor *)local_1b8);
  }
  else {
    pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar8,"ST 2052-1 document is not well-formed.\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
  }
  return this;
}

Assistant:

Result_t
AS_02::TimedText::ST2052_TextParser::h__TextParser::OpenRead()
{
  setup_default_font_family_list();

  if ( ! m_Root.ParseString(m_XMLDoc.c_str()) )
    {
      DefaultLogSink(). Error("ST 2052-1 document is not well-formed.\n");
      return RESULT_FORMAT;
    }

  m_TDesc.EncodingName = "UTF-8"; // the XML parser demands UTF-8
  m_TDesc.ResourceList.clear();
  m_TDesc.ContainerDuration = 0;
  std::set<std::string>::const_iterator i;

  // Attempt to set the profile from <conformsToStandard>
  if ( m_TDesc.NamespaceName.empty() )
    {
      ElementVisitor conforms_visitor("conformsToStandard");
      apply_visitor(m_Root, conforms_visitor);

      for ( i = conforms_visitor.value_list.begin(); i != conforms_visitor.value_list.end(); ++i )
	{
	  if ( *i == IMSC1_imageProfile || *i == IMSC1_textProfile )
	    {
	      m_TDesc.NamespaceName = *i;
	      break;
	    }
	}
    }

  // Attempt to set the profile from the use of attribute "profile"
  if ( m_TDesc.NamespaceName.empty() )
    {
      AttributeVisitor profile_visitor("profile");
      apply_visitor(m_Root, profile_visitor);

      for ( i = profile_visitor.value_list.begin(); i != profile_visitor.value_list.end(); ++i )
	{
	  if ( *i == IMSC1_imageProfile || *i == IMSC1_textProfile )
	    {
	      m_TDesc.NamespaceName = *i;
	      break;
	    }
	}
    }

  // Find image resources for later packaging as GS partitions.
  // Attempt to set the profile; infer from use of images.
  AttributeVisitor png_visitor("backgroundImage");
  apply_visitor(m_Root, png_visitor);

  for ( i = png_visitor.value_list.begin(); i != png_visitor.value_list.end(); ++i )
    {
      UUID asset_id = CreatePNGNameId(PathBasename(*i));
      TimedTextResourceDescriptor png_resource;
      memcpy(png_resource.ResourceID, asset_id.Value(), UUIDlen);
      png_resource.Type = ASDCP::TimedText::MT_PNG;
      m_TDesc.ResourceList.push_back(png_resource);
      m_ResourceTypes.insert(ResourceTypeMap_t::value_type(UUID(png_resource.ResourceID),
							   ASDCP::TimedText::MT_PNG));

      if ( m_TDesc.NamespaceName.empty() )
	{
	  m_TDesc.NamespaceName = IMSC1_imageProfile;
	}
    }

  // If images are present and profile is "text" make sure to say something.
  if ( ! m_ResourceTypes.empty() && m_TDesc.NamespaceName == IMSC1_textProfile )
    {
      DefaultLogSink().Warn("Unexpected IMSC-1 text profile; document contains images.\n ");
    }
  
  // If all else fails set the profile to "text".
  if ( m_TDesc.NamespaceName.empty() )
    {
      DefaultLogSink().Warn("Using default IMSC-1 text profile.\n ");
      m_TDesc.NamespaceName = IMSC1_textProfile;
    }

  // Find font resources for later packaging as GS partitions.
  AttributeVisitor font_visitor("fontFamily");
  apply_visitor(m_Root, font_visitor);
  char buf[64];

  for ( i = font_visitor.value_list.begin(); i != font_visitor.value_list.end(); ++i )
    {
      UUID font_id = CreateFontNameId(PathBasename(*i));

      if ( PathIsFile(font_id.EncodeHex(buf, 64))
	   || PathIsFile(*i+".ttf")
	   || PathIsFile(*i+".otf") )
	{
	  TimedTextResourceDescriptor font_resource;
	  memcpy(font_resource.ResourceID, font_id.Value(), UUIDlen);
	  font_resource.Type = ASDCP::TimedText::MT_OPENTYPE;
	  m_TDesc.ResourceList.push_back(font_resource);
	  m_ResourceTypes.insert(ResourceTypeMap_t::value_type(UUID(font_resource.ResourceID),
							       ASDCP::TimedText::MT_OPENTYPE));
	}
      else
	{
	  AutoMutex l(sg_default_font_family_list_lock);
	  if ( sg_default_font_family_list.find(*i) == sg_default_font_family_list.end() )
	    {
	      DefaultLogSink(). Error("Unable to locate external font resource \"%s\".\n", i->c_str());
	      return RESULT_FORMAT;
	    }
	}
    }

  return RESULT_OK;
}